

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_292896::NesMmuTest_controller_2_Test::TestBody
          (NesMmuTest_controller_2_Test *this)

{
  bool bVar1;
  int iVar2;
  MockSpec<bool_(n_e_s::core::INesController::Button)> *pMVar3;
  TypedExpectation<bool_(n_e_s::core::INesController::Button)> *pTVar4;
  pointer pIVar5;
  char *pcVar6;
  AssertHelper local_b68;
  Message local_b60;
  uchar local_b55;
  int local_b54;
  undefined1 local_b50 [8];
  AssertionResult gtest_ar_21;
  Message local_b38;
  uchar local_b2d;
  int local_b2c;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_20;
  Message local_b10;
  uchar local_b05;
  int local_b04;
  undefined1 local_b00 [8];
  AssertionResult gtest_ar_19;
  Action<bool_(n_e_s::core::INesController::Button)> local_ae0;
  WithoutMatchers local_ab9;
  Matcher<n_e_s::core::INesController::Button> local_ab8;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_aa0;
  AssertHelper local_a80;
  Message local_a78;
  uchar local_a6d;
  int local_a6c;
  undefined1 local_a68 [8];
  AssertionResult gtest_ar_18;
  Action<bool_(n_e_s::core::INesController::Button)> local_a48;
  WithoutMatchers local_a21;
  Matcher<n_e_s::core::INesController::Button> local_a20;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_a08;
  AssertHelper local_9e8;
  Message local_9e0;
  uchar local_9d5;
  int local_9d4;
  undefined1 local_9d0 [8];
  AssertionResult gtest_ar_17;
  Action<bool_(n_e_s::core::INesController::Button)> local_9b0;
  WithoutMatchers local_989;
  Matcher<n_e_s::core::INesController::Button> local_988;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_970;
  AssertHelper local_950;
  Message local_948;
  uchar local_93d;
  int local_93c;
  undefined1 local_938 [8];
  AssertionResult gtest_ar_16;
  Action<bool_(n_e_s::core::INesController::Button)> local_918;
  WithoutMatchers local_8f1;
  Matcher<n_e_s::core::INesController::Button> local_8f0;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_8d8;
  AssertHelper local_8b8;
  Message local_8b0;
  uchar local_8a5;
  int local_8a4;
  undefined1 local_8a0 [8];
  AssertionResult gtest_ar_15;
  Action<bool_(n_e_s::core::INesController::Button)> local_880;
  WithoutMatchers local_859;
  Matcher<n_e_s::core::INesController::Button> local_858;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_840;
  AssertHelper local_820;
  Message local_818;
  uchar local_80d;
  int local_80c;
  undefined1 local_808 [8];
  AssertionResult gtest_ar_14;
  Action<bool_(n_e_s::core::INesController::Button)> local_7e8;
  WithoutMatchers local_7c1;
  Matcher<n_e_s::core::INesController::Button> local_7c0;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_7a8;
  AssertHelper local_788;
  Message local_780;
  uchar local_775;
  int local_774;
  undefined1 local_770 [8];
  AssertionResult gtest_ar_13;
  Action<bool_(n_e_s::core::INesController::Button)> local_750;
  WithoutMatchers local_729;
  Matcher<n_e_s::core::INesController::Button> local_728;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_710;
  AssertHelper local_6f0;
  Message local_6e8;
  uchar local_6dd;
  int local_6dc;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_12;
  Action<bool_(n_e_s::core::INesController::Button)> local_6b8;
  WithoutMatchers local_691;
  Matcher<n_e_s::core::INesController::Button> local_690;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_678;
  AssertHelper local_658;
  Message local_650;
  uchar local_645;
  int local_644;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_11;
  Action<bool_(n_e_s::core::INesController::Button)> local_620;
  WithoutMatchers local_5f9;
  Matcher<n_e_s::core::INesController::Button> local_5f8;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_5e0;
  AssertHelper local_5c0;
  Message local_5b8;
  uchar local_5ad;
  int local_5ac;
  undefined1 local_5a8 [8];
  AssertionResult gtest_ar_10;
  Action<bool_(n_e_s::core::INesController::Button)> local_588;
  WithoutMatchers local_561;
  Matcher<n_e_s::core::INesController::Button> local_560;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_548;
  AssertHelper local_528;
  Message local_520;
  uchar local_515;
  int local_514;
  undefined1 local_510 [8];
  AssertionResult gtest_ar_9;
  Message local_4f8;
  uchar local_4ed;
  int local_4ec;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_8;
  Message local_4d0;
  uchar local_4c5;
  int local_4c4;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar_7;
  Action<bool_(n_e_s::core::INesController::Button)> local_4a0;
  WithoutMatchers local_479;
  Matcher<n_e_s::core::INesController::Button> local_478;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_460;
  AssertHelper local_440;
  Message local_438;
  uchar local_42d;
  int local_42c;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_6;
  Action<bool_(n_e_s::core::INesController::Button)> local_408;
  WithoutMatchers local_3e1;
  Matcher<n_e_s::core::INesController::Button> local_3e0;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_3c8;
  AssertHelper local_3a8;
  Message local_3a0;
  uchar local_395;
  int local_394;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_5;
  Action<bool_(n_e_s::core::INesController::Button)> local_370;
  WithoutMatchers local_349;
  Matcher<n_e_s::core::INesController::Button> local_348;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_330;
  AssertHelper local_310;
  Message local_308;
  uchar local_2fd;
  int local_2fc;
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_4;
  Action<bool_(n_e_s::core::INesController::Button)> local_2d8;
  WithoutMatchers local_2b1;
  Matcher<n_e_s::core::INesController::Button> local_2b0;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_298;
  AssertHelper local_278;
  Message local_270;
  uchar local_265;
  int local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_3;
  Action<bool_(n_e_s::core::INesController::Button)> local_240;
  WithoutMatchers local_219;
  Matcher<n_e_s::core::INesController::Button> local_218;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_200;
  AssertHelper local_1e0;
  Message local_1d8;
  uchar local_1cd;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_2;
  Action<bool_(n_e_s::core::INesController::Button)> local_1a8;
  WithoutMatchers local_181;
  Matcher<n_e_s::core::INesController::Button> local_180;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_168;
  AssertHelper local_148;
  Message local_140;
  uchar local_135;
  int local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_1;
  Action<bool_(n_e_s::core::INesController::Button)> local_110;
  WithoutMatchers local_e9;
  Matcher<n_e_s::core::INesController::Button> local_e8;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_d0;
  AssertHelper local_b0;
  Message local_a8;
  uchar local_9d;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  Action<bool_(n_e_s::core::INesController::Button)> local_78;
  WithoutMatchers local_55 [13];
  Matcher<n_e_s::core::INesController::Button> local_48;
  MockSpec<bool_(n_e_s::core::INesController::Button)> local_30;
  NesMmuTest_controller_2_Test *local_10;
  NesMmuTest_controller_2_Test *this_local;
  
  local_10 = this;
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_48,A);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_30,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_48);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_30,local_55,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xb4,"controller2","get(INesController::Button::A)");
  testing::Return<bool>((testing *)&gtest_ar.message_,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_78,(ReturnAction *)&gtest_ar.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_78);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_78);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_30);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_48);
  local_9c = 0x40;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_9d = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_98,"0x40","mmu->read_byte(0x4017)",&local_9c,&local_9d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xb6,pcVar6);
    testing::internal::AssertHelper::operator=(&local_b0,&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_e8,B);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_d0,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_e8);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_d0,&local_e9,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xb7,"controller2","get(INesController::Button::B)");
  testing::Return<bool>((testing *)&gtest_ar_1.message_,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_110,(ReturnAction *)&gtest_ar_1.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_110);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_110);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_1.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_d0);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_e8);
  local_134 = 0x40;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_135 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_130,"0x40","mmu->read_byte(0x4017)",&local_134,&local_135);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xb9,pcVar6);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_180,Select);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_168,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_180);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_168,&local_181,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xba,"controller2","get(INesController::Button::Select)");
  testing::Return<bool>((testing *)&gtest_ar_2.message_,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_1a8,(ReturnAction *)&gtest_ar_2.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_1a8);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_1a8);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_2.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_168);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_180);
  local_1cc = 0x40;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_1cd = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_1c8,"0x40","mmu->read_byte(0x4017)",&local_1cc,&local_1cd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xbc,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_218,Start);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_200,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_218);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_200,&local_219,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xbd,"controller2","get(INesController::Button::Start)");
  testing::Return<bool>((testing *)&gtest_ar_3.message_,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_240,(ReturnAction *)&gtest_ar_3.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_240);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_240);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_3.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_200);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_218);
  local_264 = 0x40;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_265 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_260,"0x40","mmu->read_byte(0x4017)",&local_264,&local_265);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_270);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xbf,pcVar6);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_2b0,Up);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_298,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_2b0);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_298,&local_2b1,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc0,"controller2","get(INesController::Button::Up)");
  testing::Return<bool>((testing *)&gtest_ar_4.message_,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_2d8,(ReturnAction *)&gtest_ar_4.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_2d8);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_2d8);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_4.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_298);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_2b0);
  local_2fc = 0x40;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_2fd = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_2f8,"0x40","mmu->read_byte(0x4017)",&local_2fc,&local_2fd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
  if (!bVar1) {
    testing::Message::Message(&local_308);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xc2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_310,&local_308);
    testing::internal::AssertHelper::~AssertHelper(&local_310);
    testing::Message::~Message(&local_308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_348,Down);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_330,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_348);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_330,&local_349,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc3,"controller2","get(INesController::Button::Down)");
  testing::Return<bool>((testing *)&gtest_ar_5.message_,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_370,(ReturnAction *)&gtest_ar_5.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_370);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_370);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_5.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_330);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_348);
  local_394 = 0x40;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_395 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_390,"0x40","mmu->read_byte(0x4017)",&local_394,&local_395);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_3a0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xc5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_3a8,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    testing::Message::~Message(&local_3a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_3e0,Left);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_3c8,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_3e0);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_3c8,&local_3e1,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc6,"controller2","get(INesController::Button::Left)");
  testing::Return<bool>((testing *)&gtest_ar_6.message_,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_408,(ReturnAction *)&gtest_ar_6.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_408);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_408);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_6.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_3c8);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_3e0);
  local_42c = 0x40;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_42d = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_428,"0x40","mmu->read_byte(0x4017)",&local_42c,&local_42d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
    testing::internal::AssertHelper::AssertHelper
              (&local_440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,200,pcVar6);
    testing::internal::AssertHelper::operator=(&local_440,&local_438);
    testing::internal::AssertHelper::~AssertHelper(&local_440);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_478,Right);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_460,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_478);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_460,&local_479,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xc9,"controller2","get(INesController::Button::Right)");
  testing::Return<bool>((testing *)&gtest_ar_7.message_,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_4a0,(ReturnAction *)&gtest_ar_7.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_4a0);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_4a0);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_7.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_460);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_478);
  local_4c4 = 0x40;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_4c5 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_4c0,"0x40","mmu->read_byte(0x4017)",&local_4c4,&local_4c5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar1) {
    testing::Message::Message(&local_4d0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xcb,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  local_4ec = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_4ed = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_4e8,"0x41","mmu->read_byte(0x4017)",&local_4ec,&local_4ed);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar1) {
    testing::Message::Message(&local_4f8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xcc,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_4f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_4f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  local_514 = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_515 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_510,"0x41","mmu->read_byte(0x4017)",&local_514,&local_515);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_510);
  if (!bVar1) {
    testing::Message::Message(&local_520);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_510);
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xcd,pcVar6);
    testing::internal::AssertHelper::operator=(&local_528,&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    testing::Message::~Message(&local_520);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_510);
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  (*pIVar5->_vptr_IMmu[4])(pIVar5,0x4016,1);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_560,A);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_548,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_560);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_548,&local_561,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xd3,"controller2","get(INesController::Button::A)");
  testing::Return<bool>((testing *)&gtest_ar_10.message_,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_588,(ReturnAction *)&gtest_ar_10.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_588);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_588);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_10.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_548);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_560);
  local_5ac = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_5ad = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_5a8,"0x41","mmu->read_byte(0x4017)",&local_5ac,&local_5ad);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5a8);
  if (!bVar1) {
    testing::Message::Message(&local_5b8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_5a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_5c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xd5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_5c0,&local_5b8);
    testing::internal::AssertHelper::~AssertHelper(&local_5c0);
    testing::Message::~Message(&local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5a8);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_5f8,A);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_5e0,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_5f8);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_5e0,&local_5f9,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xd6,"controller2","get(INesController::Button::A)");
  testing::Return<bool>((testing *)&gtest_ar_11.message_,false);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_620,(ReturnAction *)&gtest_ar_11.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_620);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_620);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_11.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_5e0);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_5f8);
  local_644 = 0x40;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_645 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_640,"0x40","mmu->read_byte(0x4017)",&local_644,&local_645);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xd8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  (*pIVar5->_vptr_IMmu[4])(pIVar5,0x4016);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_690,A);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_678,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_690);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_678,&local_691,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xdd,"controller2","get(INesController::Button::A)");
  testing::Return<bool>((testing *)&gtest_ar_12.message_,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_6b8,(ReturnAction *)&gtest_ar_12.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_6b8);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_6b8);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_12.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_678);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_690);
  local_6dc = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_6dd = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_6d8,"0x41","mmu->read_byte(0x4017)",&local_6dc,&local_6dd);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar1) {
    testing::Message::Message(&local_6e8);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_6f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xdf,pcVar6);
    testing::internal::AssertHelper::operator=(&local_6f0,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper(&local_6f0);
    testing::Message::~Message(&local_6e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_728,B);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_710,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_728);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_710,&local_729,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe0,"controller2","get(INesController::Button::B)");
  testing::Return<bool>((testing *)&gtest_ar_13.message_,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_750,(ReturnAction *)&gtest_ar_13.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_750);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_750);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_13.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_710);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_728);
  local_774 = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_775 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_770,"0x41","mmu->read_byte(0x4017)",&local_774,&local_775);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_770);
  if (!bVar1) {
    testing::Message::Message(&local_780);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_770);
    testing::internal::AssertHelper::AssertHelper
              (&local_788,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xe2,pcVar6);
    testing::internal::AssertHelper::operator=(&local_788,&local_780);
    testing::internal::AssertHelper::~AssertHelper(&local_788);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_770);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_7c0,Select);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_7a8,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_7c0);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_7a8,&local_7c1,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe3,"controller2","get(INesController::Button::Select)");
  testing::Return<bool>((testing *)&gtest_ar_14.message_,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_7e8,(ReturnAction *)&gtest_ar_14.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_7e8);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_7e8);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_14.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_7a8);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_7c0);
  local_80c = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_80d = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_808,"0x41","mmu->read_byte(0x4017)",&local_80c,&local_80d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_808);
  if (!bVar1) {
    testing::Message::Message(&local_818);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_808);
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xe5,pcVar6);
    testing::internal::AssertHelper::operator=(&local_820,&local_818);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    testing::Message::~Message(&local_818);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_808);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_858,Start);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_840,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_858);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_840,&local_859,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe6,"controller2","get(INesController::Button::Start)");
  testing::Return<bool>((testing *)&gtest_ar_15.message_,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_880,(ReturnAction *)&gtest_ar_15.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_880);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_880);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_15.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_840);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_858);
  local_8a4 = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_8a5 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_8a0,"0x41","mmu->read_byte(0x4017)",&local_8a4,&local_8a5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8a0);
  if (!bVar1) {
    testing::Message::Message(&local_8b0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_8a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_8b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xe8,pcVar6);
    testing::internal::AssertHelper::operator=(&local_8b8,&local_8b0);
    testing::internal::AssertHelper::~AssertHelper(&local_8b8);
    testing::Message::~Message(&local_8b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8a0);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_8f0,Up);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_8d8,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_8f0);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_8d8,&local_8f1,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xe9,"controller2","get(INesController::Button::Up)");
  testing::Return<bool>((testing *)&gtest_ar_16.message_,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_918,(ReturnAction *)&gtest_ar_16.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_918);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_918);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_16.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_8d8);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_8f0);
  local_93c = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_93d = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_938,"0x41","mmu->read_byte(0x4017)",&local_93c,&local_93d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_938);
  if (!bVar1) {
    testing::Message::Message(&local_948);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_938);
    testing::internal::AssertHelper::AssertHelper
              (&local_950,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xeb,pcVar6);
    testing::internal::AssertHelper::operator=(&local_950,&local_948);
    testing::internal::AssertHelper::~AssertHelper(&local_950);
    testing::Message::~Message(&local_948);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_938);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_988,Down);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_970,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_988);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_970,&local_989,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xec,"controller2","get(INesController::Button::Down)");
  testing::Return<bool>((testing *)&gtest_ar_17.message_,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_9b0,(ReturnAction *)&gtest_ar_17.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_9b0);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_9b0);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_17.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_970);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_988);
  local_9d4 = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_9d5 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_9d0,"0x41","mmu->read_byte(0x4017)",&local_9d4,&local_9d5);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d0);
  if (!bVar1) {
    testing::Message::Message(&local_9e0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_9d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xee,pcVar6);
    testing::internal::AssertHelper::operator=(&local_9e8,&local_9e0);
    testing::internal::AssertHelper::~AssertHelper(&local_9e8);
    testing::Message::~Message(&local_9e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_9d0);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_a20,Left);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_a08,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_a20);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_a08,&local_a21,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xef,"controller2","get(INesController::Button::Left)");
  testing::Return<bool>((testing *)&gtest_ar_18.message_,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_a48,(ReturnAction *)&gtest_ar_18.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_a48);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_a48);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_18.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_a08);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_a20);
  local_a6c = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_a6d = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_a68,"0x41","mmu->read_byte(0x4017)",&local_a6c,&local_a6d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a68);
  if (!bVar1) {
    testing::Message::Message(&local_a78);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_a68);
    testing::internal::AssertHelper::AssertHelper
              (&local_a80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf1,pcVar6);
    testing::internal::AssertHelper::operator=(&local_a80,&local_a78);
    testing::internal::AssertHelper::~AssertHelper(&local_a80);
    testing::Message::~Message(&local_a78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a68);
  testing::Matcher<n_e_s::core::INesController::Button>::Matcher(&local_ab8,Right);
  n_e_s::core::test::MockNesController::gmock_get
            (&local_aa0,&(this->super_NesMmuTest).controller2.super_MockNesController,&local_ab8);
  testing::internal::GetWithoutMatchers();
  pMVar3 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::operator()
                     (&local_aa0,&local_ab9,(void *)0x0);
  pTVar4 = testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::
           InternalExpectedAt(pMVar3,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                              ,0xf2,"controller2","get(INesController::Button::Right)");
  testing::Return<bool>((testing *)&gtest_ar_19.message_,true);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_ae0,(ReturnAction *)&gtest_ar_19.message_);
  testing::internal::TypedExpectation<bool_(n_e_s::core::INesController::Button)>::WillOnce
            (pTVar4,&local_ae0);
  testing::Action<bool_(n_e_s::core::INesController::Button)>::~Action(&local_ae0);
  testing::internal::ReturnAction<bool>::~ReturnAction((ReturnAction<bool> *)&gtest_ar_19.message_);
  testing::internal::MockSpec<bool_(n_e_s::core::INesController::Button)>::~MockSpec(&local_aa0);
  testing::Matcher<n_e_s::core::INesController::Button>::~Matcher(&local_ab8);
  local_b04 = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_b05 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_b00,"0x41","mmu->read_byte(0x4017)",&local_b04,&local_b05);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b00);
  if (!bVar1) {
    testing::Message::Message(&local_b10);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_b00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf4,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_b10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_b10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b00);
  local_b2c = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_b2d = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_b28,"0x41","mmu->read_byte(0x4017)",&local_b2c,&local_b2d);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
  if (!bVar1) {
    testing::Message::Message(&local_b38);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_b28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf5,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_b38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_b38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
  local_b54 = 0x41;
  pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                     (&(this->super_NesMmuTest).mmu);
  iVar2 = (*pIVar5->_vptr_IMmu[3])(pIVar5,0x4017);
  local_b55 = (uchar)iVar2;
  testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
            ((EqHelper *)local_b50,"0x41","mmu->read_byte(0x4017)",&local_b54,&local_b55);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b50);
  if (!bVar1) {
    testing::Message::Message(&local_b60);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_b50);
    testing::internal::AssertHelper::AssertHelper
              (&local_b68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
               ,0xf6,pcVar6);
    testing::internal::AssertHelper::operator=(&local_b68,&local_b60);
    testing::internal::AssertHelper::~AssertHelper(&local_b68);
    testing::Message::~Message(&local_b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b50);
  return;
}

Assistant:

TEST_F(NesMmuTest, controller_2) {
    // No button pressed, extra reads at end to make sure controller is not read
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::B))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Select))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Start))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Up))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Down))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Left))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Right))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));

    // Latch controller button states by toggling strobe (0x4016, bit 0), now
    // new controller read is possible (while stope is high, button A's state
    // should be returned on read)
    mmu->write_byte(0x4016, 0x01);
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    mmu->write_byte(0x4016, 0x00);

    // All buttons pressed, extra reads at end to make sure controller is not
    // read
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::B))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Select))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Start))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Up))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Down))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Left))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Right))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
}